

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_SpatializerReverb.cpp
# Opt level: O0

int SpatializerReverb::SetFloatParameterCallback(UnityAudioEffectState *state,int index,float value)

{
  EffectData *pEVar1;
  EffectData *data;
  float value_local;
  int index_local;
  UnityAudioEffectState *state_local;
  
  pEVar1 = UnityAudioEffectState::GetEffectData<SpatializerReverb::EffectData>(state);
  if (index < 2) {
    pEVar1->p[index] = value;
  }
  state_local._4_4_ = (uint)(index >= 2);
  return state_local._4_4_;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK SetFloatParameterCallback(UnityAudioEffectState* state, int index, float value)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        if (index >= P_NUM)
            return UNITY_AUDIODSP_ERR_UNSUPPORTED;
        data->p[index] = value;
        return UNITY_AUDIODSP_OK;
    }